

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9VmCallUserFunctionAp(jx9_vm *pVm,jx9_value *pFunc,jx9_value *pResult,...)

{
  char in_AL;
  sxi32 sVar1;
  void **ppvVar2;
  uint uVar3;
  undefined8 in_RCX;
  ulong uVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  jx9_value *pArg;
  void **local_120;
  void *local_108;
  SySet local_100;
  void *local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Da;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_100.nUsed = 0;
  local_100.nSize = 0;
  local_100.eSize = 8;
  local_100.nCursor = 0;
  local_100.pBase = (jx9_value **)0x0;
  local_100.pUserData = (void *)0x0;
  uVar3 = 0x18;
  local_120 = &ap[0].overflow_arg_area;
  local_100.pAllocator = &pVm->sAllocator;
  local_d8[3] = (void *)in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  while( true ) {
    uVar4 = (ulong)uVar3;
    if (uVar4 < 0x29) {
      uVar3 = uVar3 + 8;
      ppvVar2 = (void **)((long)local_d8 + uVar4);
    }
    else {
      ppvVar2 = local_120;
      local_120 = local_120 + 1;
    }
    local_108 = *ppvVar2;
    if (local_108 == (void *)0x0) break;
    SySetPut(&local_100,&local_108);
  }
  sVar1 = jx9VmCallUserFunction
                    (pVm,pFunc,local_100.nUsed,(jx9_value **)local_100.pBase,(jx9_value *)0x0);
  SySetRelease(&local_100);
  return sVar1;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmCallUserFunctionAp(
	jx9_vm *pVm,       /* Target VM */
	jx9_value *pFunc,  /* Callback name */
	jx9_value *pResult, /* Store callback return value here. NULL otherwise */
	...                /* 0 (Zero) or more Callback arguments */ 
	)
{
	jx9_value *pArg;
	SySet aArg;
	va_list ap;
	sxi32 rc;
	SySetInit(&aArg, &pVm->sAllocator, sizeof(jx9_value *));
	/* Copy arguments one after one */
	va_start(ap, pResult);
	for(;;){
		pArg = va_arg(ap, jx9_value *);
		if( pArg == 0 ){
			break;
		}
		SySetPut(&aArg, (const void *)&pArg);
	}
	/* Call the core routine */
	rc = jx9VmCallUserFunction(&(*pVm), pFunc, (int)SySetUsed(&aArg), (jx9_value **)SySetBasePtr(&aArg), pResult);
	/* Cleanup */
	SySetRelease(&aArg);
	return rc;
}